

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jacobi.h
# Opt level: O2

void Eigen::internal::apply_rotation_in_the_plane_selector<float,_float,_2,_0,_false>::run
               (float *x,Index incrx,float *y,Index incry,Index size,float c,float s)

{
  float fVar1;
  float fVar2;
  long lVar3;
  
  lVar3 = 0;
  if (0 < size) {
    lVar3 = size;
  }
  while (lVar3 != 0) {
    fVar1 = *x;
    fVar2 = *y;
    *x = c * fVar1 + fVar2 * s;
    *y = fVar1 * -s + fVar2 * c;
    y = y + incry;
    x = x + incrx;
    lVar3 = lVar3 + -1;
  }
  return;
}

Assistant:

static EIGEN_DEVICE_FUNC
  inline void run(Scalar *x, Index incrx, Scalar *y, Index incry, Index size, OtherScalar c, OtherScalar s)
  {
    for(Index i=0; i<size; ++i)
    {
      Scalar xi = *x;
      Scalar yi = *y;
      *x =  c * xi + numext::conj(s) * yi;
      *y = -s * xi + numext::conj(c) * yi;
      x += incrx;
      y += incry;
    }
  }